

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O3

int __thiscall ON_String::Replace(ON_String *this,char *token1,char *token2)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  ON_Internal_Empty_aString *pOVar5;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int i;
  int len;
  ON_SimpleArray<int> n;
  int local_78;
  uint local_74;
  size_t local_70;
  size_t local_68;
  size_t local_60;
  uint local_54;
  ON_SimpleArray<int> local_50;
  char *local_38;
  
  iVar7 = 0;
  if ((token1 != (char *)0x0) && (*token1 != '\0')) {
    pcVar8 = "";
    if (token2 != (char *)0x0) {
      pcVar8 = token2;
    }
    sVar4 = strlen(token1);
    uVar14 = (uint)sVar4;
    if (0 < (int)uVar14) {
      local_70 = strlen(pcVar8);
      pOVar5 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      if (this->m_s == (char *)0x0) {
        pOVar5 = &empty_astring;
      }
      uVar10 = (pOVar5->header).string_length;
      local_60 = CONCAT44(local_60._4_4_,uVar10 - uVar14);
      iVar7 = 0;
      if ((int)uVar14 <= (int)uVar10) {
        local_50._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
        local_50.m_a = (int *)0x0;
        local_50.m_count = 0;
        local_50.m_capacity = 0;
        local_54 = uVar10;
        local_38 = pcVar8;
        ON_SimpleArray<int>::SetCapacity(&local_50,0x20);
        pcVar8 = this->m_s;
        local_78 = 0;
        local_68 = sVar4;
        do {
          iVar7 = local_78;
          iVar3 = strncmp(pcVar8,token1,(ulong)(uVar14 & 0x7fffffff));
          if (iVar3 == 0) {
            ON_SimpleArray<int>::Append(&local_50,&local_78);
            local_78 = local_78 + (int)local_68;
            pcVar8 = pcVar8 + (uVar14 & 0x7fffffff);
          }
          else {
            pcVar8 = pcVar8 + 1;
            local_78 = iVar7 + 1;
          }
        } while (local_78 <= (int)local_60);
        iVar7 = local_50.m_count;
        uVar9 = local_50._16_8_ & 0xffffffff;
        iVar13 = (int)local_70;
        iVar3 = (int)local_68;
        local_74 = (iVar13 - iVar3) * local_50.m_count + uVar10;
        if (local_74 == 0) {
          Destroy(this);
        }
        else {
          CopyArray(this);
          uVar14 = uVar10;
          if ((int)uVar10 < (int)local_74) {
            uVar14 = local_74;
          }
          ReserveArray(this,(long)(int)uVar14);
          if (iVar3 < iVar13) {
            if (0 < iVar7) {
              uVar6 = 0;
              do {
                local_50.m_a[uVar6] = local_50.m_a[uVar6] + (int)local_68;
                uVar6 = uVar6 + 1;
              } while (uVar9 != uVar6);
              if (0 < iVar7) {
                local_60 = local_70 & 0xffffffff;
                uVar14 = local_74;
                do {
                  uVar15 = (ulong)uVar14;
                  uVar6 = (ulong)uVar10;
                  uVar11 = local_50.m_a[uVar9 - 1];
                  if ((int)uVar11 < (int)uVar10) {
                    uVar15 = (ulong)(int)uVar14;
                    uVar6 = (ulong)(int)uVar10;
                    do {
                      lVar2 = uVar6 - 1;
                      uVar6 = uVar6 - 1;
                      this->m_s[uVar15 - 1] = this->m_s[lVar2];
                      uVar15 = uVar15 - 1;
                    } while ((long)(int)uVar11 < (long)uVar6);
                  }
                  uVar14 = (int)uVar15 - (int)local_70;
                  uVar10 = (int)uVar6 - (int)local_68;
                  memcpy(this->m_s + (int)uVar14,local_38,local_60);
                  bVar1 = 1 < (long)uVar9;
                  uVar9 = uVar9 - 1;
                } while (bVar1);
              }
            }
          }
          else {
            uVar6 = (ulong)(uint)*local_50.m_a;
            ON_SimpleArray<int>::Append(&local_50,(int *)&local_54);
            if (0 < iVar7) {
              uVar14 = (uint)local_70;
              local_60 = (size_t)(uVar14 & 0x7fffffff);
              uVar12 = 0;
              uVar15 = uVar6;
              do {
                if (0 < (int)uVar14) {
                  memcpy(this->m_s + (int)uVar15,local_38,local_60);
                  uVar15 = (ulong)((int)uVar15 + uVar14);
                }
                uVar11 = (int)uVar6 + (int)local_68;
                uVar6 = (ulong)uVar11;
                uVar10 = local_50.m_a[uVar12 + 1];
                if ((int)uVar11 < (int)uVar10) {
                  uVar15 = (ulong)(int)uVar15;
                  uVar6 = (ulong)(int)uVar11;
                  do {
                    pcVar8 = this->m_s + uVar6;
                    uVar6 = uVar6 + 1;
                    this->m_s[uVar15] = *pcVar8;
                    uVar15 = uVar15 + 1;
                  } while ((long)uVar6 < (long)(int)uVar10);
                }
                uVar12 = uVar12 + 1;
              } while (uVar12 != uVar9);
            }
          }
          pcVar8 = this->m_s;
          pOVar5 = (ON_Internal_Empty_aString *)(pcVar8 + -0xc);
          if (pcVar8 == (char *)0x0) {
            pOVar5 = &empty_astring;
          }
          (pOVar5->header).string_length = local_74;
          pcVar8[(int)local_74] = '\0';
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&local_50);
      }
    }
  }
  return iVar7;
}

Assistant:

int ON_String::Replace( const char* token1, const char* token2 )
{
  int count = 0;

  if ( 0 != token1 && 0 != token1[0] )
  {
    if ( 0 == token2 )
      token2 = "";
    const int len1 = (int)strlen(token1);
    if ( len1 > 0 )
    {
      const int len2 = (int)strlen(token2);
      int len = Length();
      if ( len >= len1 )
      {
        // in-place
        ON_SimpleArray<int> n(32);
        const char* s = m_s;
        int i;
        for ( i = 0; i <= len-len1; /*empty*/ )
        {
          if ( strncmp(s,token1,len1) )
          {
            s++;
            i++;
          }
          else
          {
            n.Append(i);
            i += len1;
            s += len1;
          }
        }

        count = n.Count();

        // reserve array space - must be done even when len2 <= len1
        // so that shared arrays are not corrupted.
        const int newlen = len + (count*(len2-len1));
        if ( 0 == newlen )
        {
          Destroy();
          return count;
        }

        CopyArray();

        // 24 August 2006 Dale Lear
        //    This used to say
        //       ReserveArray(newlen);
        //    but when newlen < len and the string had multiple
        //    references, the ReserveArray(newlen) call truncated
        //    the input array.  
        ReserveArray( ((newlen<len) ? len : newlen) );

        int i0, i1, ni, j;

        if ( len2 > len1 )
        {
          // copy from back to front
          i1 = newlen;
          i0 = len;
          for ( ni =0; ni < count; ni++ )
            n[ni] = n[ni] + len1;
          for ( ni = count-1; ni >= 0; ni-- )
          {
            j = n[ni];
            while ( i0 > j )
            {
              i0--;
              i1--;
              m_s[i1] = m_s[i0];
            }
            i1 -= len2;
            i0 -= len1;
            memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
          }
        }
        else
        {
          // copy from front to back
          i0 = i1 = n[0];
          n.Append(len);
          for ( ni = 0; ni < count; ni++ )
          {
            if ( len2 > 0 )
            {
              memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
              i1 += len2;
            }
            i0 += len1;
            j = n[ni+1];
            while ( i0 < j )
            {
              m_s[i1++] = m_s[i0++];
            }
          }
        }
        Header()->string_length = newlen;
        m_s[newlen] = 0;
      }
    }
  }

  return count;
}